

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_cond_clear(void)

{
  mp_int *x_00;
  mp_int *x_01;
  size_t sVar1;
  ulong local_20;
  size_t i;
  mp_int *x;
  mp_int *a;
  
  x_00 = mp_random_bits_fn(0x200,random_read);
  x_01 = mp_copy(x_00);
  local_20 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x10);
    if (sVar1 <= local_20) break;
    mp_copy_into(x_01,x_00);
    log_start();
    mp_cond_clear(x_00,(uint)local_20 & 1);
    log_end();
    local_20 = local_20 + 1;
  }
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_cond_clear(void)
{
    mp_int *a = mp_random_bits(512);
    mp_int *x = mp_copy(a);
    for (size_t i = 0; i < looplimit(16); i++) {
        mp_copy_into(x, a);
        log_start();
        mp_cond_clear(a, i & 1);
        log_end();
    }
    mp_free(a);
    mp_free(x);
}